

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llava.cpp
# Opt level: O0

llava_image_embed *
llava_image_embed_make_with_bytes
          (clip_ctx *ctx_clip,int n_threads,uchar *image_bytes,int image_bytes_length)

{
  bool bVar1;
  clip_image_u8 *image_embd_out;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  llava_image_embed *result;
  bool image_embed_result;
  int n_image_pos;
  float *image_embed;
  clip_image_u8 *img;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  clip_image_u8 *in_stack_ffffffffffffffc8;
  float *pfVar4;
  undefined4 in_stack_ffffffffffffffd8;
  int n_threads_00;
  undefined4 in_stack_ffffffffffffffe8;
  llava_image_embed *local_8;
  
  n_threads_00 = (int)((ulong)in_RDX >> 0x20);
  image_embd_out = clip_image_u8_init();
  bVar1 = clip_image_load_from_bytes
                    ((uchar *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(size_t)image_embd_out,
                     in_stack_ffffffffffffffc8);
  if (bVar1) {
    pfVar4 = (float *)0x0;
    iVar3 = 0;
    bVar1 = llava_image_embed_make_with_clip_img
                      ((clip_ctx *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),n_threads_00,
                       (clip_image_u8 *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                       (float **)image_embd_out,(int *)0x0);
    uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc0);
    if (bVar1) {
      clip_image_u8_free((clip_image_u8 *)CONCAT44(iVar3,uVar2));
      local_8 = (llava_image_embed *)malloc(0x10);
      local_8->embed = pfVar4;
      local_8->n_image_pos = iVar3;
    }
    else {
      clip_image_u8_free((clip_image_u8 *)CONCAT44(iVar3,uVar2));
      fprintf(_stderr,"%s: couldn\'t embed the image\n","llava_image_embed_make_with_bytes");
      local_8 = (llava_image_embed *)0x0;
    }
  }
  else {
    clip_image_u8_free((clip_image_u8 *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    fprintf(_stderr,"%s: can\'t load image from bytes, is it a valid image?",
            "llava_image_embed_make_with_bytes");
    local_8 = (llava_image_embed *)0x0;
  }
  return local_8;
}

Assistant:

struct llava_image_embed * llava_image_embed_make_with_bytes(struct clip_ctx * ctx_clip, int n_threads, const unsigned char * image_bytes, int image_bytes_length) {
    clip_image_u8 * img = clip_image_u8_init();
    if (!clip_image_load_from_bytes(image_bytes, image_bytes_length, img)) {
        clip_image_u8_free(img);
        LOG_ERR("%s: can't load image from bytes, is it a valid image?", __func__);
        return NULL;
    }

    float* image_embed = NULL;
    int n_image_pos = 0;
    bool image_embed_result = llava_image_embed_make_with_clip_img(ctx_clip, n_threads, img, &image_embed, &n_image_pos);
    if (!image_embed_result) {
        clip_image_u8_free(img);
        LOG_ERR("%s: couldn't embed the image\n", __func__);
        return NULL;
    }

    clip_image_u8_free(img);
    auto result = (llava_image_embed*)malloc(sizeof(llava_image_embed));
    result->embed = image_embed;
    result->n_image_pos = n_image_pos;
    return result;
}